

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void * alsaMidiHandler(void *ptr)

{
  byte bVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  code *pcVar6;
  long lVar7;
  byte *pbVar8;
  snd_seq_event_t *psVar9;
  pointer puVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  pollfd pVar15;
  pollfd *__fds;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uStack_80;
  pollfd local_78;
  byte *local_70;
  snd_seq_event_t *ev;
  MidiMessage message;
  void *pvStack_40;
  bool dummy;
  
  __fds = &local_78;
  puVar4 = *(undefined8 **)((long)ptr + 0x40);
  message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ev = (snd_seq_event_t *)0x0;
  message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined4 *)(puVar4 + 4) = 0x20;
  pVar15 = (pollfd)(puVar4 + 3);
  uStack_80 = 0x109908;
  iVar11 = snd_midi_event_new(0,pVar15);
  if (iVar11 < 0) {
    *(undefined1 *)((long)ptr + 0x39) = 0;
    uStack_80 = 0x109d13;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "\nMidiInAlsa::alsaMidiHandler: error initializing MIDI event parser!\n\n",0x45);
  }
  else {
    uStack_80 = 0x109919;
    pvStack_40 = malloc((ulong)*(uint *)(puVar4 + 4));
    if (pvStack_40 == (void *)0x0) {
      *(undefined1 *)((long)ptr + 0x39) = 0;
      uStack_80 = 0x109d22;
      snd_midi_event_free(*(undefined8 *)pVar15);
      *(undefined8 *)pVar15 = 0;
      uStack_80 = 0x109d41;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "\nMidiInAlsa::alsaMidiHandler: error initializing buffer memory!\n\n",0x41);
      __fds = &local_78;
    }
    else {
      uStack_80 = 0x10992e;
      snd_midi_event_init(*(undefined8 *)pVar15);
      uStack_80 = 0x10993b;
      snd_midi_event_no_status(*(undefined8 *)pVar15,1);
      uStack_80 = 0x109948;
      iVar11 = snd_seq_poll_descriptors_count(*puVar4,1);
      uVar14 = (long)iVar11 * 8 + 0x17U & 0xfffffffffffffff0;
      lVar7 = -uVar14;
      __fds = (pollfd *)((long)&local_78 + lVar7);
      uVar5 = *puVar4;
      *(undefined8 *)((long)&uStack_80 + lVar7) = 0x10997d;
      snd_seq_poll_descriptors(uVar5,(long)&local_70 - uVar14,iVar11,1);
      __fds->fd = *(int *)((long)puVar4 + 0x4c);
      *(undefined2 *)((long)&local_78 + lVar7 + 4) = 1;
      if (*(char *)((long)ptr + 0x39) == '\x01') {
        bVar18 = false;
        local_78 = pVar15;
        do {
          uVar5 = *puVar4;
          *(undefined8 *)((long)&uStack_80 + lVar7) = 0x1099b2;
          iVar12 = snd_seq_event_input_pending(uVar5,1);
          if (iVar12 == 0) {
            *(undefined8 *)((long)&uStack_80 + lVar7) = 0x1099f1;
            iVar12 = poll(__fds,(long)iVar11 + 1,-1);
            if ((-1 < iVar12) && ((*(byte *)((long)&local_78 + lVar7 + 6) & 1) != 0)) {
              iVar12 = __fds->fd;
              *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109a0e;
              read(iVar12,(void *)((long)&message.timeStamp + 7),1);
            }
          }
          else {
            uVar5 = *puVar4;
            *(undefined8 *)((long)&uStack_80 + lVar7) = 0x1099c2;
            iVar12 = snd_seq_event_input(uVar5,&local_70);
            if (iVar12 == -0x1c) {
              *(undefined8 *)((long)&uStack_80 + lVar7) = 0x1099df;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "\nMidiInAlsa::alsaMidiHandler: MIDI input buffer overrun!\n\n",0x3a);
            }
            else if (iVar12 < 1) {
              *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109a2c;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "\nMidiInAlsa::alsaMidiHandler: unknown MIDI input error!\n",0x38);
              *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109a38;
              perror("System reports");
            }
            else {
              if ((!bVar18) &&
                 ((snd_seq_event_t *)
                  message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != ev)) {
                message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start = &ev->type;
              }
              bVar1 = *local_70;
              if (bVar1 < 0x2a) {
                if (((bVar1 != 0x16) && (bVar1 != 0x24)) && (bVar1 != 0x25)) {
LAB_00109af3:
                  bVar17 = true;
                  goto LAB_00109af5;
                }
                bVar1 = *(byte *)((long)ptr + 0x38) & 2;
LAB_00109a7c:
                bVar17 = bVar1 == 0;
              }
              else {
                if (bVar1 - 0x42 < 2) goto LAB_00109aef;
                if (bVar1 == 0x2a) {
                  bVar1 = *(byte *)((long)ptr + 0x38) & 4;
                  goto LAB_00109a7c;
                }
                if (bVar1 != 0x82) goto LAB_00109af3;
                if ((*(byte *)((long)ptr + 0x38) & 1) == 0) {
                  bVar17 = true;
                  if (*(uint *)(puVar4 + 4) < *(uint *)(local_70 + 0x10)) {
                    *(uint *)(puVar4 + 4) = *(uint *)(local_70 + 0x10);
                    *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109ab8;
                    free(pvStack_40);
                    uVar3 = *(uint *)(puVar4 + 4);
                    *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109ac1;
                    pvStack_40 = malloc((ulong)uVar3);
                    if (pvStack_40 == (void *)0x0) {
                      *(undefined1 *)((long)ptr + 0x39) = 0;
                      *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109ae7;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "\nMidiInAlsa::alsaMidiHandler: error resizing buffer memory!\n\n",
                                 0x3d);
                      pvStack_40 = (void *)0x0;
                      goto LAB_00109aef;
                    }
                  }
                }
                else {
LAB_00109aef:
                  bVar17 = false;
                }
              }
LAB_00109af5:
              pbVar8 = local_70;
              pVar15 = local_78;
              if (bVar17) {
                uVar5 = puVar4[3];
                uVar2 = *(undefined4 *)(puVar4 + 4);
                *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109b0e;
                lVar13 = snd_midi_event_decode(uVar5,pvStack_40,uVar2,pbVar8);
                puVar10 = message.bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pVar15 = local_78;
                if (0 < lVar13) {
                  if (bVar18) {
                    *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109b38;
                    std::vector<unsigned_char,std::allocator<unsigned_char>>::
                    _M_range_insert<unsigned_char*>
                              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&ev,puVar10,
                               pvStack_40,lVar13 + (long)pvStack_40);
                  }
                  else {
                    *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109b56;
                    std::vector<unsigned_char,std::allocator<unsigned_char>>::
                    _M_assign_aux<unsigned_char*>
                              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&ev,pvStack_40
                               ,lVar13 + (long)pvStack_40);
                  }
                  if (*local_70 == 0x82) {
                    bVar18 = message.bytes.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start[-1] != 0xf7;
                  }
                  else {
                    bVar18 = false;
                  }
                  if (!bVar18) {
                    message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    uVar14 = (ulong)*(uint *)(puVar4 + 8);
                    uVar16 = (ulong)*(uint *)((long)puVar4 + 0x44);
                    uVar3 = *(uint *)(local_70 + 8);
                    if (uVar3 < *(uint *)((long)puVar4 + 0x44)) {
                      iVar12 = (int)((long)(uVar16 - (long)(int)uVar3) / 1000000000);
                      uVar16 = uVar16 - (long)(iVar12 * 1000000000 + 1000000000);
                      uVar14 = uVar14 + (long)iVar12 + 1;
                    }
                    if (1000000000 < (long)(uVar3 - uVar16)) {
                      lVar13 = (long)((long)(int)uVar3 - uVar16) / 1000000000;
                      uVar14 = uVar14 - lVar13;
                      uVar16 = uVar16 + (lVar13 * 0x3b9aca0000000000 >> 0x20);
                    }
                    iVar12 = *(int *)(local_70 + 4);
                    puVar4[8] = *(undefined8 *)(local_70 + 4);
                    if (*(char *)((long)ptr + 0x3a) == '\x01') {
                      *(undefined1 *)((long)ptr + 0x3a) = 0;
                    }
                    else {
                      message.bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage =
                           (pointer)((double)(long)((long)(int)uVar3 - uVar16) * 1e-09 +
                                    (double)(long)((long)iVar12 - uVar14));
                    }
                  }
                }
              }
              pbVar8 = local_70;
              *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109c68;
              snd_seq_free_event(pbVar8);
              puVar10 = message.bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
              if (((snd_seq_event_t *)
                   message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start != ev) && (!bVar18)) {
                if (*(char *)((long)ptr + 0x48) == '\x01') {
                  uVar5 = *(undefined8 *)((long)ptr + 0x58);
                  pcVar6 = *(code **)((long)ptr + 0x50);
                  *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109c98;
                  (*pcVar6)(puVar10,&ev,uVar5);
                }
                else {
                  *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109ca9;
                  bVar17 = MidiInApi::MidiQueue::push((MidiQueue *)ptr,(MidiMessage *)&ev);
                  if (!bVar17) {
                    *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109cc9;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "\nMidiInAlsa: message queue limit reached!!\n\n",0x2c);
                  }
                }
              }
            }
          }
        } while (*(char *)((long)ptr + 0x39) != '\0');
      }
      if (pvStack_40 != (void *)0x0) {
        *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109cdc;
        free(pvStack_40);
      }
      uVar5 = *(undefined8 *)pVar15;
      *(undefined8 *)((long)&uStack_80 + lVar7) = 0x109ce4;
      snd_midi_event_free(uVar5);
      puVar4[3] = 0;
      puVar4[6] = puVar4[7];
    }
  }
  psVar9 = ev;
  if (ev != (snd_seq_event_t *)0x0) {
    uVar14 = (long)message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)ev;
    __fds[-1].fd = 0x109d56;
    __fds[-1].events = 0;
    __fds[-1].revents = 0;
    operator_delete(psVar9,uVar14);
  }
  return (void *)0x0;
}

Assistant:

static void *alsaMidiHandler( void *ptr )
{
  MidiInApi::RtMidiInData *data = static_cast<MidiInApi::RtMidiInData *> (ptr);
  AlsaMidiData *apiData = static_cast<AlsaMidiData *> (data->apiData);

  long nBytes;
  double time;
  bool continueSysex = false;
  bool doDecode = false;
  MidiInApi::MidiMessage message;
  int poll_fd_count;
  struct pollfd *poll_fds;

  snd_seq_event_t *ev;
  int result;
  apiData->bufferSize = 32;
  result = snd_midi_event_new( 0, &apiData->coder );
  if ( result < 0 ) {
    data->doInput = false;
    std::cerr << "\nMidiInAlsa::alsaMidiHandler: error initializing MIDI event parser!\n\n";
    return 0;
  }
  unsigned char *buffer = (unsigned char *) malloc( apiData->bufferSize );
  if ( buffer == NULL ) {
    data->doInput = false;
    snd_midi_event_free( apiData->coder );
    apiData->coder = 0;
    std::cerr << "\nMidiInAlsa::alsaMidiHandler: error initializing buffer memory!\n\n";
    return 0;
  }
  snd_midi_event_init( apiData->coder );
  snd_midi_event_no_status( apiData->coder, 1 ); // suppress running status messages

  poll_fd_count = snd_seq_poll_descriptors_count( apiData->seq, POLLIN ) + 1;
  poll_fds = (struct pollfd*)alloca( poll_fd_count * sizeof( struct pollfd ));
  snd_seq_poll_descriptors( apiData->seq, poll_fds + 1, poll_fd_count - 1, POLLIN );
  poll_fds[0].fd = apiData->trigger_fds[0];
  poll_fds[0].events = POLLIN;

  while ( data->doInput ) {

    if ( snd_seq_event_input_pending( apiData->seq, 1 ) == 0 ) {
      // No data pending
      if ( poll( poll_fds, poll_fd_count, -1) >= 0 ) {
        if ( poll_fds[0].revents & POLLIN ) {
          bool dummy;
          int res = read( poll_fds[0].fd, &dummy, sizeof(dummy) );
          (void) res;
        }
      }
      continue;
    }

    // If here, there should be data.
    result = snd_seq_event_input( apiData->seq, &ev );
    if ( result == -ENOSPC ) {
      std::cerr << "\nMidiInAlsa::alsaMidiHandler: MIDI input buffer overrun!\n\n";
      continue;
    }
    else if ( result <= 0 ) {
      std::cerr << "\nMidiInAlsa::alsaMidiHandler: unknown MIDI input error!\n";
      perror("System reports");
      continue;
    }

    // This is a bit weird, but we now have to decode an ALSA MIDI
    // event (back) into MIDI bytes.  We'll ignore non-MIDI types.
    if ( !continueSysex ) message.bytes.clear();

    doDecode = false;
    switch ( ev->type ) {

    case SND_SEQ_EVENT_PORT_SUBSCRIBED:
#if defined(__RTMIDI_DEBUG__)
      std::cout << "MidiInAlsa::alsaMidiHandler: port connection made!\n";
#endif
      break;

    case SND_SEQ_EVENT_PORT_UNSUBSCRIBED:
#if defined(__RTMIDI_DEBUG__)
      std::cerr << "MidiInAlsa::alsaMidiHandler: port connection has closed!\n";
      std::cout << "sender = " << (int) ev->data.connect.sender.client << ":"
                << (int) ev->data.connect.sender.port
                << ", dest = " << (int) ev->data.connect.dest.client << ":"
                << (int) ev->data.connect.dest.port
                << std::endl;
#endif
      break;

    case SND_SEQ_EVENT_QFRAME: // MIDI time code
      if ( !( data->ignoreFlags & 0x02 ) ) doDecode = true;
      break;

    case SND_SEQ_EVENT_TICK: // 0xF9 ... MIDI timing tick
      if ( !( data->ignoreFlags & 0x02 ) ) doDecode = true;
      break;

    case SND_SEQ_EVENT_CLOCK: // 0xF8 ... MIDI timing (clock) tick
      if ( !( data->ignoreFlags & 0x02 ) ) doDecode = true;
      break;

    case SND_SEQ_EVENT_SENSING: // Active sensing
      if ( !( data->ignoreFlags & 0x04 ) ) doDecode = true;
      break;

    case SND_SEQ_EVENT_SYSEX:
      if ( (data->ignoreFlags & 0x01) ) break;
      if ( ev->data.ext.len > apiData->bufferSize ) {
        apiData->bufferSize = ev->data.ext.len;
        free( buffer );
        buffer = (unsigned char *) malloc( apiData->bufferSize );
        if ( buffer == NULL ) {
          data->doInput = false;
          std::cerr << "\nMidiInAlsa::alsaMidiHandler: error resizing buffer memory!\n\n";
          break;
        }
      }
      doDecode = true;
      break;

    default:
      doDecode = true;
    }

    if ( doDecode ) {

      nBytes = snd_midi_event_decode( apiData->coder, buffer, apiData->bufferSize, ev );
      if ( nBytes > 0 ) {
        // The ALSA sequencer has a maximum buffer size for MIDI sysex
        // events of 256 bytes.  If a device sends sysex messages larger
        // than this, they are segmented into 256 byte chunks.  So,
        // we'll watch for this and concatenate sysex chunks into a
        // single sysex message if necessary.
        if ( !continueSysex )
          message.bytes.assign( buffer, &buffer[nBytes] );
        else
          message.bytes.insert( message.bytes.end(), buffer, &buffer[nBytes] );

        continueSysex = ( ( ev->type == SND_SEQ_EVENT_SYSEX ) && ( message.bytes.back() != 0xF7 ) );
        if ( !continueSysex ) {

          // Calculate the time stamp:
          message.timeStamp = 0.0;

          // Method 1: Use the system time.
          //(void)gettimeofday(&tv, (struct timezone *)NULL);
          //time = (tv.tv_sec * 1000000) + tv.tv_usec;

          // Method 2: Use the ALSA sequencer event time data.
          // (thanks to Pedro Lopez-Cabanillas!).

          // Using method from:
          // https://www.gnu.org/software/libc/manual/html_node/Elapsed-Time.html

          // Perform the carry for the later subtraction by updating y.
          // Temp var y is timespec because computation requires signed types,
          // while snd_seq_real_time_t has unsigned types.
          snd_seq_real_time_t &x( ev->time.time );
          struct timespec y;
          y.tv_nsec = apiData->lastTime.tv_nsec;
          y.tv_sec = apiData->lastTime.tv_sec;
          if ( x.tv_nsec < y.tv_nsec ) {
              int nsec = (y.tv_nsec - (int)x.tv_nsec) / 1000000000 + 1;
              y.tv_nsec -= 1000000000 * nsec;
              y.tv_sec += nsec;
          }
          if ( x.tv_nsec - y.tv_nsec > 1000000000 ) {
              int nsec = ((int)x.tv_nsec - y.tv_nsec) / 1000000000;
              y.tv_nsec += 1000000000 * nsec;
              y.tv_sec -= nsec;
          }

          // Compute the time difference.
          time = (int)x.tv_sec - y.tv_sec + ((int)x.tv_nsec - y.tv_nsec)*1e-9;

          apiData->lastTime = ev->time.time;

          if ( data->firstMessage == true )
            data->firstMessage = false;
          else
            message.timeStamp = time;
        }
        else {
#if defined(__RTMIDI_DEBUG__)
          std::cerr << "\nMidiInAlsa::alsaMidiHandler: event parsing error or not a MIDI event!\n\n";
#endif
        }
      }
    }

    snd_seq_free_event( ev );
    if ( message.bytes.size() == 0 || continueSysex ) continue;

    if ( data->usingCallback ) {
      RtMidiIn::RtMidiCallback callback = (RtMidiIn::RtMidiCallback) data->userCallback;
      callback( message.timeStamp, &message.bytes, data->userData );
    }
    else {
      // As long as we haven't reached our queue size limit, push the message.
      if ( !data->queue.push( message ) )
        std::cerr << "\nMidiInAlsa: message queue limit reached!!\n\n";
    }
  }

  if ( buffer ) free( buffer );
  snd_midi_event_free( apiData->coder );
  apiData->coder = 0;
  apiData->thread = apiData->dummy_thread_id;
  return 0;
}